

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_iterator.h
# Opt level: O0

uint32_t cppcms::utf8::next<char_const*>(char **p,char *e,bool html,bool param_4)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  uchar tmp;
  uint32_t c;
  int trail_size;
  uchar lead;
  uint local_24;
  char local_20;
  uint32_t local_4;
  
  if (*in_RDI == in_RSI) {
    return 0xffffffff;
  }
  pbVar2 = (byte *)*in_RDI;
  *in_RDI = (long)(pbVar2 + 1);
  bVar1 = *pbVar2;
  iVar4 = trail_length(bVar1);
  if (iVar4 < 0) {
    return 0xffffffff;
  }
  if (iVar4 == 0) {
    if (((in_DL & 1) != 0) &&
       ((((bVar1 < 0x20 || (bVar1 == 0x7f)) && (bVar1 != 9)) && ((bVar1 != 10 && (bVar1 != 0xd))))))
    {
      return 0xffffffff;
    }
    return (uint)bVar1;
  }
  local_20 = (char)iVar4;
  local_24 = (uint)bVar1 & (1 << (6U - local_20 & 0x1f)) - 1U;
  if (iVar4 != 1) {
    if (iVar4 != 2) {
      if (iVar4 != 3) goto LAB_003f4b34;
      if (*in_RDI == in_RSI) {
        return 0xffffffff;
      }
      pbVar2 = (byte *)*in_RDI;
      *in_RDI = (long)(pbVar2 + 1);
      bVar1 = *pbVar2;
      bVar3 = is_trail(bVar1);
      if (!bVar3) {
        return 0xffffffff;
      }
      local_24 = local_24 << 6 | bVar1 & 0x3f;
    }
    if (*in_RDI == in_RSI) {
      return 0xffffffff;
    }
    pbVar2 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar2 + 1);
    bVar1 = *pbVar2;
    bVar3 = is_trail(bVar1);
    if (!bVar3) {
      return 0xffffffff;
    }
    local_24 = local_24 << 6 | bVar1 & 0x3f;
  }
  if (*in_RDI == in_RSI) {
    return 0xffffffff;
  }
  pbVar2 = (byte *)*in_RDI;
  *in_RDI = (long)(pbVar2 + 1);
  bVar1 = *pbVar2;
  bVar3 = is_trail(bVar1);
  if (!bVar3) {
    return 0xffffffff;
  }
  local_24 = local_24 << 6 | bVar1 & 0x3f;
LAB_003f4b34:
  bVar3 = utf::valid(local_24);
  if (bVar3) {
    iVar5 = width(local_24);
    if (iVar5 == iVar4 + 1) {
      if (((in_DL & 1) == 0) || (0x9f < local_24)) {
        local_4 = local_24;
      }
      else {
        local_4 = 0xffffffff;
      }
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

uint32_t next(Iterator &p,Iterator e,bool html=false,bool /*decode*/=false)
	{
		using utf::illegal;
		if(p==e)
			return illegal;

		unsigned char lead = *p++;

		// First byte is fully validated here
		int trail_size = trail_length(lead);

		if(trail_size < 0)
			return illegal;

		//
		// Ok as only ASCII may be of size = 0
		// also optimize for ASCII text
		//
		if(trail_size == 0) {
			if(!html || (lead >= 0x20 && lead!=0x7F) || lead==0x9 || lead==0x0A || lead==0x0D)
				return lead;
			return illegal;
		}

		uint32_t c = lead & ((1<<(6-trail_size))-1);

		// Read the rest
		unsigned char tmp;
		switch(trail_size) {
			case 3:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 2:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 1:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
		}

		// Check code point validity: no surrogates and
		// valid range
		if(!utf::valid(c))
			return illegal;

		// make sure it is the most compact representation
		if(width(c)!=trail_size + 1)
			return illegal;
		
		if(html && c<0xA0)
			return illegal;
		return c;
	}